

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O1

int dasm_encode(BuildCtx *ctx,void *buffer)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  dasm_State *pdVar4;
  int *piVar5;
  int *piVar6;
  char *pcVar7;
  uint uVar8;
  byte *pbVar9;
  long lVar10;
  char cVar11;
  ulong __n;
  uchar *mm;
  byte *pbVar12;
  byte bVar13;
  int iVar14;
  uint *puVar15;
  byte *pbVar16;
  int iVar17;
  byte *__s;
  
  pdVar4 = ctx->D;
  __s = (byte *)buffer;
  if (0 < pdVar4->maxsection) {
    lVar10 = 0;
    do {
      puVar15 = (uint *)pdVar4->sections[lVar10].buf;
      iVar2 = pdVar4->sections[lVar10].pos;
      piVar5 = pdVar4->sections[lVar10].rbuf;
      while (puVar15 != (uint *)(piVar5 + iVar2)) {
        uVar8 = *puVar15;
        puVar15 = puVar15 + 1;
        pbVar9 = (byte *)0x0;
        pbVar12 = pdVar4->actionlist + (int)uVar8;
        do {
          bVar13 = *pbVar12;
          __n = 0;
          if ((byte)(bVar13 + 0x17) < 0x12) {
            __n = (ulong)*puVar15;
            puVar15 = puVar15 + 1;
          }
          uVar8 = (uint)__n;
          pbVar16 = pbVar12 + 1;
          if (0x16 < bVar13 - 0xe9) {
LAB_0010662e:
            *__s = bVar13;
            __s = __s + 1;
            goto switchD_00106364_caseD_f2;
          }
          cVar11 = (char)__n;
          iVar14 = (int)buffer;
          iVar17 = (int)__s;
          switch((uint)bVar13) {
          case 0xe9:
            pbVar12 = pbVar9;
            if (pbVar9 == (byte *)0x0) {
              pbVar12 = __s;
            }
            pbVar9 = (byte *)0x0;
            if ((*pbVar16 & 0xfe) == 0xee) {
              pbVar9 = pbVar12;
            }
            if (uVar8 == 0) {
              bVar13 = pbVar12[-1] & 7;
              if (bVar13 == 4) {
                bVar13 = *pbVar12 & 7;
              }
              if (bVar13 == 5) goto LAB_0010644e;
              pbVar12[-1] = pbVar12[-1] + 0x80;
              iVar14 = 9;
            }
            else {
LAB_0010644e:
              iVar14 = 10;
              if ((int)cVar11 == uVar8) {
                pbVar12[-1] = pbVar12[-1] - 0x40;
                iVar14 = 0;
              }
            }
            if (iVar14 == 10) break;
            if (iVar14 == 9) goto switchD_00106364_caseD_f2;
            if (iVar14 == 0) goto LAB_00106737;
            goto LAB_001067af;
          default:
switchD_00106364_caseD_ea:
            goto LAB_00106737;
          case 0xec:
switchD_00106364_caseD_ec:
            *(short *)__s = (short)__n;
            __s = __s + 2;
            goto switchD_00106364_caseD_f2;
          case 0xed:
            break;
          case 0xee:
            if ((int)cVar11 != uVar8) {
              pbVar9 = (byte *)0x0;
              goto switchD_00106364_caseD_ec;
            }
LAB_001065d0:
            if (pbVar9 == (byte *)0x0) {
              pbVar9 = __s;
            }
            pbVar9[-2] = pbVar9[-2] + 2;
            pbVar9 = (byte *)0x0;
LAB_00106737:
            *__s = (byte)__n;
            __s = __s + 1;
            goto switchD_00106364_caseD_f2;
          case 0xef:
            if ((int)cVar11 == uVar8) goto LAB_001065d0;
            pbVar9 = (byte *)0x0;
            break;
          case 0xf0:
            bVar13 = pbVar12[1];
            pbVar16 = __s + -(ulong)(bVar13 & 7);
            if (((__n & 8) == 0) || (0x9f < bVar13)) {
              if ((__n & 0x10) != 0) {
                if ((char)*pbVar16 < '\0') {
                  *pbVar16 = 0xc5;
                  pbVar16[1] = pbVar16[1] & 0x80 | pbVar16[2];
                  pbVar16 = pbVar16 + 2;
                }
                if (pbVar16 + 1 < __s) {
                  memmove(pbVar16,pbVar16 + 1,(size_t)(__s + ~(ulong)pbVar16));
                }
                if (pbVar9 != (byte *)0x0) {
                  pbVar9 = pbVar9 + -1;
                }
                __s = __s + -1;
                goto LAB_00106763;
              }
            }
            else {
              if ((char)*pbVar16 < '\0') {
                pbVar16[1] = pbVar16[1] ^ ' ' << (bVar13 >> 6);
              }
              else {
                *pbVar16 = *pbVar16 ^ '\x01' << (bVar13 >> 6);
              }
LAB_00106763:
              __n = (ulong)(uVar8 & 7);
            }
            iVar14 = (int)__n;
            if (bVar13 < 0xc0) {
              if (bVar13 < 0x40) {
                if ((iVar14 == 4) && (bVar13 < 0x20)) {
                  __s[-1] = __s[-1] ^ 4;
                  *__s = 0x20;
                  __s = __s + 1;
                  __n = 4;
                }
              }
              else {
                __n = (ulong)(uint)(iVar14 << 3);
              }
            }
            else {
              __n = (ulong)(uint)(iVar14 << 4);
            }
            __s[-1] = __s[-1] ^ (byte)__n;
            goto LAB_001067a7;
          case 0xf1:
            if (uVar8 != 0) {
              memset(__s,(uint)*pbVar16,__n);
              __s = __s + (ulong)(uVar8 - 1) + 1;
            }
            goto LAB_001067a7;
          case 0xf2:
          case 0xf9:
            goto switchD_00106364_caseD_f2;
          case 0xf3:
switchD_00106364_caseD_f3:
            goto LAB_00106745;
          case 0xf4:
            pbVar16 = pbVar12 + 2;
            if (-1 < (int)uVar8) goto switchD_00106364_caseD_f5;
            puVar15 = puVar15 + 1;
            uVar8 = *(uint *)(pdVar4->globals + -uVar8);
LAB_00106745:
            __n = (ulong)((uVar8 - (int)__s) - 4);
            break;
          case 0xf5:
switchD_00106364_caseD_f5:
            piVar6 = pdVar4->sections[(int)uVar8 >> 0x18].rbuf;
            iVar3 = piVar6[(int)uVar8];
            if (iVar3 < 0) {
              __n = (ulong)(uint)piVar6[(long)(int)uVar8 + 1];
              iVar14 = 0x18;
            }
            else {
              uVar8 = *puVar15;
              __n = (ulong)((uVar8 + (iVar14 - iVar17) + iVar3) - 4);
              if (uVar8 == 0) {
                iVar14 = 10;
              }
              else {
                if (uVar8 == 4) {
                  __s[-2] = __s[-1] - 0x10;
                  __s = __s + -1;
                }
                else {
                  __s[-1] = 0xeb;
                }
                iVar14 = 0xb;
              }
            }
            uVar8 = (uint)__n;
            puVar15 = puVar15 + 1;
            if (iVar14 != 10) {
              if (iVar14 != 0xb) goto switchD_00106364_caseD_f3;
              goto switchD_00106364_caseD_ea;
            }
            break;
          case 0xf6:
            pbVar16 = pbVar12 + 2;
            if (-1 < (int)uVar8) goto switchD_00106364_caseD_f7;
            __n = (ulong)*(uint *)(pdVar4->globals + -uVar8);
            break;
          case 0xf7:
switchD_00106364_caseD_f7:
            piVar6 = pdVar4->sections[(int)uVar8 >> 0x18].rbuf;
            iVar17 = piVar6[(int)uVar8];
            if (iVar17 < 0) {
              __n = (ulong)(uint)piVar6[(long)(int)uVar8 + 1];
            }
            else {
              __n = (ulong)(uint)(iVar17 + iVar14);
            }
            break;
          case 0xf8:
            if (9 < (ulong)pbVar12[1]) {
              if (pbVar12[2] == 0xf2) {
                __n = (ulong)*puVar15;
              }
              pdVar4->globals[pbVar12[1]] = (void *)((long)(int)__n + (long)buffer);
            }
            goto LAB_001067a7;
          case 0xfa:
            bVar13 = pbVar12[1];
            if ((iVar17 - iVar14 & (uint)bVar13) != 0) {
              pbVar16 = __s + (1 - (long)buffer);
              do {
                *__s = 0x90;
                __s = __s + 1;
                uVar8 = (uint)pbVar16;
                pbVar16 = pbVar16 + 1;
              } while ((uVar8 & bVar13) != 0);
            }
LAB_001067a7:
            pbVar16 = pbVar12 + 2;
            goto switchD_00106364_caseD_f2;
          case 0xfb:
            if (199 < ctx->nreloc) {
              dasm_encode_cold_1();
            }
            bVar13 = *pbVar16;
            bVar1 = pbVar12[2];
            if (relocmap[bVar1] < 0) {
              relocmap[bVar1] = ctx->nrelocsym;
              pcVar7 = sym_decorate(ctx,"",extnames[bVar1]);
              iVar14 = ctx->nrelocsym;
              ctx->relocsym[iVar14] = pcVar7;
              ctx->nrelocsym = iVar14 + 1;
            }
            iVar14 = ctx->nreloc;
            ctx->reloc[iVar14].ofs = iVar17 - *(int *)&ctx->code;
            ctx->reloc[iVar14].sym = relocmap[bVar1];
            ctx->reloc[iVar14].type = (uint)bVar13;
            ctx->nreloc = iVar14 + 1;
            pbVar16 = pbVar12 + 3;
            __n = 0;
            break;
          case 0xfc:
            bVar13 = pbVar12[1];
            pbVar16 = pbVar12 + 2;
            goto LAB_0010662e;
          case 0xfd:
            pbVar9 = __s;
            goto switchD_00106364_caseD_f2;
          case 0xfe:
          case 0xff:
            iVar14 = 0x1d;
            goto LAB_001067af;
          }
          *(int *)__s = (int)__n;
          __s = __s + 4;
switchD_00106364_caseD_f2:
          iVar14 = 0;
LAB_001067af:
          pbVar12 = pbVar16;
        } while (iVar14 == 0);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pdVar4->maxsection);
  }
  return (uint)((byte *)((long)buffer + pdVar4->codesize) != __s) << 0x19;
}

Assistant:

int dasm_encode(Dst_DECL, void *buffer)
{
  dasm_State *D = Dst_REF;
  unsigned char *base = (unsigned char *)buffer;
  unsigned char *cp = base;
  int secnum;

  /* Encode all code sections. No support for data sections (yet). */
  for (secnum = 0; secnum < D->maxsection; secnum++) {
    dasm_Section *sec = D->sections + secnum;
    int *b = sec->buf;
    int *endb = sec->rbuf + sec->pos;

    while (b != endb) {
      dasm_ActList p = D->actionlist + *b++;
      unsigned char *mark = NULL;
      while (1) {
	int action = *p++;
	int n = (action >= DASM_DISP && action <= DASM_ALIGN) ? *b++ : 0;
	switch (action) {
	case DASM_DISP: if (!mark) mark = cp; {
	  unsigned char *mm = mark;
	  if (*p != DASM_IMM_DB && *p != DASM_IMM_WB) mark = NULL;
	  if (n == 0) { int mrm = mm[-1]&7; if (mrm == 4) mrm = mm[0]&7;
	    if (mrm != 5) { mm[-1] -= 0x80; break; } }
	  if (((n+128) & -256) != 0) goto wd; else mm[-1] -= 0x40;
	}
	  /* fallthrough */
	case DASM_IMM_S: case DASM_IMM_B: wb: dasmb(n); break;
	case DASM_IMM_DB: if (((n+128)&-256) == 0) {
	    db: if (!mark) mark = cp; mark[-2] += 2; mark = NULL; goto wb;
	  } else mark = NULL;
	  /* fallthrough */
	case DASM_IMM_D: wd: dasmd(n); break;
	case DASM_IMM_WB: if (((n+128)&-256) == 0) goto db; else mark = NULL;
	  /* fallthrough */
	case DASM_IMM_W: dasmw(n); break;
	case DASM_VREG: {
	  int t = *p++;
	  unsigned char *ex = cp - (t&7);
	  if ((n & 8) && t < 0xa0) {
	    if (*ex & 0x80) ex[1] ^= 0x20 << (t>>6); else *ex ^= 1 << (t>>6);
	    n &= 7;
	  } else if (n & 0x10) {
	    if (*ex & 0x80) {
	      *ex = 0xc5; ex[1] = (ex[1] & 0x80) | ex[2]; ex += 2;
	    }
	    while (++ex < cp) ex[-1] = *ex;
	    if (mark) mark--;
	    cp--;
	    n &= 7;
	  }
	  if (t >= 0xc0) n <<= 4;
	  else if (t >= 0x40) n <<= 3;
	  else if (n == 4 && t < 0x20) { cp[-1] ^= n; *cp++ = 0x20; }
	  cp[-1] ^= n;
	  break;
	}
	case DASM_REL_LG: p++; if (n >= 0) goto rel_pc;
	  b++; n = (int)(ptrdiff_t)D->globals[-n];
	  /* fallthrough */
	case DASM_REL_A: rel_a: n -= (int)(ptrdiff_t)(cp+4); goto wd; /* !x64 */
	case DASM_REL_PC: rel_pc: {
	  int shrink = *b++;
	  int *pb = DASM_POS2PTR(D, n); if (*pb < 0) { n = pb[1]; goto rel_a; }
	  n = *pb - ((int)(cp-base) + 4-shrink);
	  if (shrink == 0) goto wd;
	  if (shrink == 4) { cp--; cp[-1] = *cp-0x10; } else cp[-1] = 0xeb;
	  goto wb;
	}
	case DASM_IMM_LG:
	  p++; if (n < 0) { n = (int)(ptrdiff_t)D->globals[-n]; goto wd; }
	  /* fallthrough */
	case DASM_IMM_PC: {
	  int *pb = DASM_POS2PTR(D, n);
	  n = *pb < 0 ? pb[1] : (*pb + (int)(ptrdiff_t)base);
	  goto wd;
	}
	case DASM_LABEL_LG: {
	  int idx = *p++;
	  if (idx >= 10)
	    D->globals[idx] = (void *)(base + (*p == DASM_SETLABEL ? *b : n));
	  break;
	}
	case DASM_LABEL_PC: case DASM_SETLABEL: break;
	case DASM_SPACE: { int fill = *p++; while (n--) *cp++ = fill; break; }
	case DASM_ALIGN:
	  n = *p++;
	  while (((cp-base) & n)) *cp++ = 0x90; /* nop */
	  break;
	case DASM_EXTERN: n = DASM_EXTERN(Dst, cp, p[1], *p); p += 2; goto wd;
	case DASM_MARK: mark = cp; break;
	case DASM_ESC: action = *p++;
	  /* fallthrough */
	default: *cp++ = action; break;
	case DASM_SECTION: case DASM_STOP: goto stop;
	}
      }
      stop: (void)0;
    }
  }

  if (base + D->codesize != cp)  /* Check for phase errors. */
    return DASM_S_PHASE;
  return DASM_S_OK;
}